

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O2

void __thiscall SceneRender::render(SceneRender *this,Uniforms *_uniforms)

{
  bool bVar1;
  Camera *_camera;
  long lVar2;
  Fbo *_fbo;
  size_t _texLoc;
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar3;
  _Rb_tree_node_base *p_Var4;
  allocator local_f9;
  Tracker *local_f8;
  string local_f0 [2];
  vec<3,_float,_(glm::qualifier)0> *local_b0;
  vec<3,_float,_(glm::qualifier)0> *local_a8;
  mat4 *local_a0;
  _Rb_tree_node_base *local_98;
  string local_90;
  string local_70 [2];
  
  renderBackground(this,_uniforms);
  if (this->m_depth_test == true) {
    glEnable(0xb71);
  }
  vera::blendMode(this->m_blend);
  _camera = (_uniforms->super_Scene).activeCamera;
  if (((_camera->super_Node).bChange != false) || ((this->m_origin).bChange == true)) {
    vera::setCamera(_camera);
    vera::applyMatrix(&(this->m_origin).m_transformMatrix);
  }
  local_f8 = &_uniforms->tracker;
  if ((_uniforms->tracker).m_running == true) {
    std::__cxx11::string::string((string *)local_f0,"render:scene:floor",(allocator *)local_70);
    Tracker::begin(local_f8,local_f0);
    std::__cxx11::string::~string((string *)local_f0);
  }
  renderFloor(this,_uniforms);
  if ((_uniforms->tracker).m_running == true) {
    std::__cxx11::string::string((string *)local_f0,"render:scene:floor",(allocator *)local_70);
    Tracker::end(local_f8,local_f0);
    std::__cxx11::string::~string((string *)local_f0);
  }
  vera::cullingMode(this->m_culling);
  local_98 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a0 = &(this->m_origin).m_transformMatrix;
  local_a8 = &(this->m_origin).m_position;
  local_b0 = &(this->m_floor).super_Node.m_position;
  for (p_Var4 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ; bVar1 = (_uniforms->tracker).m_running, p_Var4 != local_98;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    if (bVar1 != false) {
      std::operator+(local_f0,"render:scene:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)(p_Var4 + 2) + 0x2b0));
      Tracker::begin(local_f8,local_f0);
      std::__cxx11::string::~string((string *)local_f0);
    }
    vera::Shader::use((Shader *)(*(long *)(p_Var4 + 2) + 0x158));
    (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,*(long *)(p_Var4 + 2) + 0x158,1);
    lVar2 = *(long *)(p_Var4 + 2);
    std::__cxx11::string::string((string *)&local_90,"u_modelViewProjectionMatrix",&local_f9);
    vera::getProjectionViewWorldMatrix();
    pmVar3 = (mat<4,_4,_float,_(glm::qualifier)0> *)(**(code **)(**(long **)(p_Var4 + 2) + 0x100))()
    ;
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_f0,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)local_70,pmVar3);
    vera::Shader::setUniform((Shader *)(lVar2 + 0x158),&local_90,(mat4 *)local_f0,false);
    std::__cxx11::string::~string((string *)&local_90);
    lVar2 = *(long *)(p_Var4 + 2);
    std::__cxx11::string::string((string *)local_70,"u_modelMatrix",(allocator *)&local_90);
    pmVar3 = (mat<4,_4,_float,_(glm::qualifier)0> *)(**(code **)(**(long **)(p_Var4 + 2) + 0x100))()
    ;
    glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_f0,local_a0,pmVar3);
    vera::Shader::setUniform((Shader *)(lVar2 + 0x158),local_70,(mat4 *)local_f0,false);
    std::__cxx11::string::~string((string *)local_70);
    lVar2 = *(long *)(p_Var4 + 2);
    std::__cxx11::string::string((string *)local_f0,"u_model",(allocator *)&local_90);
    local_70[0]._0_12_ = (undefined1  [12])glm::operator+(local_a8,local_b0);
    vera::Shader::setUniform((Shader *)(lVar2 + 0x158),local_f0,(vec3 *)local_70);
    std::__cxx11::string::~string((string *)local_f0);
    for (local_90._M_dataplus._M_p = (pointer)0x0;
        local_90._M_dataplus._M_p <
        (pointer)((long)(this->buffersFbo).
                        super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->buffersFbo).
                        super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3);
        local_90._M_dataplus._M_p = local_90._M_dataplus._M_p + 1) {
      lVar2 = *(long *)(p_Var4 + 2);
      vera::toString<unsigned_long>(local_70,(unsigned_long *)&local_90);
      std::operator+(local_f0,"u_sceneBuffer",local_70);
      _fbo = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
             _M_impl.super__Vector_impl_data._M_start[(long)local_90._M_dataplus._M_p];
      _texLoc = *(size_t *)(*(long *)(p_Var4 + 2) + 0x198);
      *(size_t *)(*(long *)(p_Var4 + 2) + 0x198) = _texLoc + 1;
      vera::Shader::setUniformTexture((Shader *)(lVar2 + 0x158),local_f0,_fbo,_texLoc);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string((string *)local_70);
    }
    vera::Model::render(*(Model **)(p_Var4 + 2));
    if ((_uniforms->tracker).m_running != false) {
      std::operator+(local_f0,"render:scene:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)(p_Var4 + 2) + 0x2b0));
      Tracker::end(local_f8,local_f0);
      std::__cxx11::string::~string((string *)local_f0);
    }
  }
  if (bVar1 != false) {
    std::__cxx11::string::string((string *)local_f0,"render:scene:devlook",(allocator *)local_70);
    Tracker::begin(local_f8,local_f0);
    std::__cxx11::string::~string((string *)local_f0);
  }
  renderDevLook(this,_uniforms);
  if ((_uniforms->tracker).m_running == true) {
    std::__cxx11::string::string((string *)local_f0,"render:scene:devlook",(allocator *)local_70);
    Tracker::end(local_f8,local_f0);
    std::__cxx11::string::~string((string *)local_f0);
  }
  if (this->m_depth_test == true) {
    glDisable(0xb71);
  }
  if (this->m_blend != BLEND_NONE) {
    vera::blendMode(BLEND_ALPHA);
  }
  if (this->m_culling != CULL_NONE) {
    glDisable(0xb44);
  }
  return;
}

Assistant:

void SceneRender::render(Uniforms& _uniforms) {
    // Render Background
    renderBackground(_uniforms);

    // Begining of DEPTH for 3D 
    if (m_depth_test)
        glEnable(GL_DEPTH_TEST);

    vera::blendMode(m_blend);

    if (_uniforms.activeCamera->bChange || m_origin.bChange) {
        vera::setCamera( _uniforms.activeCamera );
        vera::applyMatrix( m_origin.getTransformMatrix() );
    }

    TRACK_BEGIN("render:scene:floor")
    renderFloor(_uniforms );
    TRACK_END("render:scene:floor")

    vera::cullingMode(m_culling);

    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        TRACK_BEGIN("render:scene:" + it->second->getName() )

        // bind the shader
        it->second->getShader()->use();

        // Update Uniforms and textures variables to the shader
        _uniforms.feedTo( it->second->getShader(), true, true );

        // Pass special uniforms
        it->second->getShader()->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * it->second->getTransformMatrix() );
        it->second->getShader()->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
        it->second->getShader()->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );

        for (size_t i = 0; i < buffersFbo.size(); i++)
            it->second->getShader()->setUniformTexture("u_sceneBuffer" + vera::toString(i), buffersFbo[i], it->second->getShader()->textureIndex++);

        it->second->render();

        TRACK_END("render:scene:" + it->second->getName() )
    }

    TRACK_BEGIN("render:scene:devlook")
    renderDevLook(_uniforms);
    TRACK_END("render:scene:devlook")

    if (m_depth_test)
        glDisable(GL_DEPTH_TEST);

    if (m_blend != 0)
        vera::blendMode(vera::BLEND_ALPHA);

    if (m_culling != 0)
        glDisable(GL_CULL_FACE);
}